

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_field_sample_generated.h
# Opt level: O2

int __thiscall keyfield::sample::Apple::KeyCompareWithValue(Apple *this,Color *_color)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  
  iVar3 = Color::KeyCompareWithValue(&this->color_,(Array<float,_(unsigned_short)3> *)_color);
  if (iVar3 == 0) {
    bVar1 = _color->tag_;
    iVar3 = 0;
    bVar2 = (this->color_).tag_;
    if (bVar2 != bVar1) {
      iVar3 = (uint)(bVar2 >= bVar1 && bVar2 != bVar1) - (uint)(bVar2 < bVar1);
    }
  }
  return iVar3;
}

Assistant:

int KeyCompareWithValue(const keyfield::sample::Color &_color) const {
    const auto &lhs_color = color();
    const auto &rhs_color = _color;
    const auto rhs_color_rgb = rhs_color.rgb();
    const auto rgb_compare_result = lhs_color.KeyCompareWithValue(rhs_color_rgb);
    if (rgb_compare_result != 0)
      return rgb_compare_result;
    const auto lhs_color_tag = lhs_color.tag();
    const auto rhs_color_tag = rhs_color.tag();
    if (lhs_color_tag != rhs_color_tag)
      return static_cast<int>(lhs_color_tag > rhs_color_tag) - static_cast<int>(lhs_color_tag < rhs_color_tag);
    return 0;
  }